

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicsLinearization.cpp
# Opt level: O3

void iDynTree::ForwardDynamicsLinearizationWrtBaseTwist
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,LinkNetExternalWrenches *linkExtWrenches,
               JointDOFsDoubleArray *jointTorques,ForwardDynamicsLinearizationInternalBuffers *bufs,
               FreeFloatingAcc *robotAcc,FreeFloatingStateLinearization *A)

{
  double *pdVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  pointer pSVar12;
  pointer pMVar13;
  pointer pSVar14;
  pointer pSVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  pointer pSVar41;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *pCVar42;
  pointer pSVar43;
  undefined8 uVar44;
  Model *pMVar45;
  uint uVar46;
  int iVar47;
  PointerType ptr;
  LinkPositions *this;
  Link *pLVar48;
  LinkIndex LVar49;
  IJoint *pIVar50;
  LinkIndex LVar51;
  JointPosDoubleArray *pJVar52;
  undefined4 extraout_var;
  Transform *pTVar53;
  undefined4 extraout_var_00;
  VectorDynSize *this_00;
  double dof;
  double *pdVar54;
  SpatialMotionVector *pSVar55;
  SpatialForceVector *pSVar56;
  ArticulatedBodyInertia *__src;
  undefined4 extraout_var_02;
  size_t sVar57;
  size_t sVar58;
  size_t sVar59;
  undefined8 *puVar60;
  long lVar61;
  long lVar62;
  double *pdVar63;
  ulong uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double dVar72;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  double dVar74;
  undefined1 auVar75 [16];
  double dVar76;
  type tmp;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  Matrix6x6 dVb_pa;
  ArticulatedBodyInertia Ia;
  assign_op<double,_double> local_5e9;
  FreeFloatingVel *local_5e8;
  FreeFloatingPos *local_5e0;
  DOFSpatialForceArray *local_5d8;
  double local_5c8;
  Model *local_5c0;
  LinkArticulatedBodyInertias *local_5b8;
  double dStack_5b0;
  Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> local_5a8;
  undefined1 local_598 [24];
  _func_int ***ppp_Stack_580;
  undefined1 local_578 [16];
  pointer local_568;
  double dStack_560;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *local_558;
  pointer pSStack_550;
  double local_548 [2];
  undefined1 local_538 [16];
  double local_528;
  double dStack_520;
  double local_518 [4];
  double local_4f8;
  double dStack_4f0;
  double local_4e8 [4];
  double local_4c8;
  double dStack_4c0;
  double local_4b8 [4];
  double local_498;
  double dStack_490;
  double local_488 [2];
  Matrix<double,_6,_1,_0,_6,_1> local_478;
  Scalar local_448 [6];
  undefined1 local_418;
  ArticulatedBodyInertia *local_408;
  undefined8 uStack_400;
  LinkArticulatedBodyInertias *local_3f0;
  VectorDynSize *local_3e8;
  DOFSpatialForceArray *local_3e0;
  long local_3d8;
  _func_int ***local_3d0;
  undefined1 local_3c8 [64];
  undefined1 local_388 [8];
  double dStack_380;
  Transform *pTStack_378;
  double dStack_370;
  double adStack_368 [2];
  pointer local_358;
  double dStack_350;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *local_348;
  pointer pSStack_340;
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_248;
  double dStack_240;
  double local_238;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  undefined1 *local_218;
  PointerType pdStack_210;
  double local_208;
  pointer pSStack_200;
  pointer local_1f8;
  double dStack_1f0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *local_1e8;
  pointer pSStack_1e0;
  double local_1d8;
  double dStack_1d0;
  scalar_constant_op<double> local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_108 [6];
  undefined4 extraout_var_01;
  
  local_5e8 = robotVel;
  local_5e0 = robotPos;
  local_5c0 = model;
  uVar46 = Traversal::getNrOfVisitedLinks(traversal);
  if (uVar46 != 0) {
    this = &bufs->linkPos;
    uVar64 = 0;
    do {
      pLVar48 = Traversal::getLink(traversal,uVar64);
      LVar49 = Link::getIndex(pLVar48);
      pLVar48 = Traversal::getParentLink(traversal,uVar64);
      pIVar50 = Traversal::getParentJoint(traversal,uVar64);
      if (pLVar48 == (Link *)0x0) {
        iDynTree::Transform::Identity();
        pTVar53 = LinkPositions::operator()(this,LVar49);
        iDynTree::Transform::operator=(pTVar53,(Transform *)local_598);
        memset((bufs->dVb_linkBiasAcceleration).
               super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
               ._M_impl.super__Vector_impl_data._M_start + LVar49,0,0x120);
      }
      else {
        LVar51 = Link::getIndex(pLVar48);
        pJVar52 = FreeFloatingPos::jointPos(local_5e0);
        Link::getIndex(pLVar48);
        iVar47 = (*pIVar50->_vptr_IJoint[10])(pIVar50,pJVar52,LVar49);
        LinkPositions::operator()(this,LVar51);
        iDynTree::Transform::operator*
                  ((Transform *)local_598,(Transform *)CONCAT44(extraout_var,iVar47));
        pTVar53 = LinkPositions::operator()(this,LVar49);
        iDynTree::Transform::operator=(pTVar53,(Transform *)local_598);
        iVar47 = (*pIVar50->_vptr_IJoint[4])(pIVar50);
        if (iVar47 == 0) {
          memset((bufs->dVb_linkBiasAcceleration).
                 super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                 ._M_impl.super__Vector_impl_data._M_start + LVar49,0,0x120);
        }
        else {
          iVar47 = (*pIVar50->_vptr_IJoint[0x18])(pIVar50);
          this_00 = &FreeFloatingVel::jointVel(local_5e8)->super_VectorDynSize;
          local_5d8 = (DOFSpatialForceArray *)
                      iDynTree::VectorDynSize::operator()(this_00,CONCAT44(extraout_var_00,iVar47));
          DOFSpatialMotionArray::operator()
                    ((DOFSpatialMotionArray *)bufs,CONCAT44(extraout_var_00,iVar47));
          iDynTree::SpatialMotionVector::operator*
                    ((SpatialMotionVector *)local_228,-(double)local_5d8);
          iDynTree::SpatialMotionVector::asCrossProductMatrix();
          LinkPositions::operator()(this,LVar49);
          iDynTree::Transform::asAdjointTransform();
          local_3c8._0_8_ =
               (bufs->dVb_linkBiasAcceleration).
               super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
               ._M_impl.super__Vector_impl_data._M_start + LVar49;
          local_108[0].m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = (PointerType)local_598;
          local_108[0].m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = (PointerType)local_388;
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>>
                    ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_3c8
                     ,local_108,(assign_op<double,_double> *)&local_5a8,(type)0x0);
        }
      }
      pSVar12 = (bufs->dVl_linkLocalBiasWrench).
                super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                ._M_impl.super__Vector_impl_data._M_start;
      LinkPositions::operator()(this,LVar49);
      iDynTree::Transform::asAdjointTransform();
      local_228._0_8_ =
           (bufs->dVb_linkBiasWrench).
           super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
           ._M_impl.super__Vector_impl_data._M_start + LVar49;
      local_388 = (undefined1  [8])(pSVar12 + LVar49);
      pTStack_378 = (Transform *)local_598;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>>
                ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_228,
                 (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)local_388,(assign_op<double,_double> *)local_108,(type)0x0);
      uVar64 = uVar64 + 1;
      uVar46 = Traversal::getNrOfVisitedLinks(traversal);
    } while (uVar64 < uVar46);
  }
  uVar46 = Traversal::getNrOfVisitedLinks(traversal);
  if (-1 < (int)(uVar46 - 1)) {
    local_5b8 = &(bufs->aba).linkABIs;
    local_5d8 = &(bufs->aba).U;
    local_5e8 = (FreeFloatingVel *)&(bufs->aba).D;
    uVar64 = (ulong)(uVar46 - 1);
    do {
      pLVar48 = Traversal::getLink(traversal,uVar64);
      LVar49 = Link::getIndex(pLVar48);
      pLVar48 = Traversal::getParentLink(traversal,uVar64);
      pIVar50 = Traversal::getParentJoint(traversal,uVar64);
      if (pLVar48 != (Link *)0x0) {
        iDynTree::ArticulatedBodyInertia::ArticulatedBodyInertia
                  ((ArticulatedBodyInertia *)local_108);
        iVar47 = (*pIVar50->_vptr_IJoint[4])(pIVar50);
        if (iVar47 != 0) {
          iVar47 = (*pIVar50->_vptr_IJoint[0x18])(pIVar50);
          dof = (double)CONCAT44(extraout_var_01,iVar47);
          local_408 = LinkArticulatedBodyInertias::operator()(local_5b8,LVar49);
          DOFSpatialForceArray::operator()(local_5d8,(size_t)dof);
          local_5c8 = dof;
          pdVar54 = (double *)
                    iDynTree::VectorDynSize::operator()((VectorDynSize *)local_5e8,(ulong)dof);
          iDynTree::ArticulatedBodyInertia::ABADyadHelper((SpatialForceVector *)local_388,*pdVar54);
          iDynTree::ArticulatedBodyInertia::operator-((ArticulatedBodyInertia *)local_598,local_408)
          ;
          memcpy(local_108,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                  *)local_598,0xd8);
          pSVar55 = DOFSpatialMotionArray::operator()((DOFSpatialMotionArray *)bufs,(size_t)dof);
          pdVar54 = (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                    super_Vector3.m_data + 2;
          local_388 = (undefined1  [8])*pdVar54;
          dStack_380 = (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                       super_Vector3.m_data[0];
          pdVar63 = (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                    super_Vector3.m_data + 1;
          pTStack_378 = (Transform *)*pdVar63;
          dStack_370 = (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                       super_Vector3.m_data[2];
          pSVar12 = (bufs->dVb_linkBiasWrench).
                    super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar13 = (bufs->dVb_u).
                    super__Vector_base<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_568 = pSVar12 + LVar49;
          local_598._0_16_ =
               *(undefined1 (*) [16])
                (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                super_Vector3.m_data ^ _DAT_0016f0c0;
          register0x000012c0 = *(undefined1 (*) [16])pdVar54 ^ _DAT_0016f0c0;
          local_578 = *(undefined1 (*) [16])pdVar63 ^ _DAT_0016f0c0;
          local_548[1] = 2.96439387504748e-323;
          auVar66._0_8_ = local_598._0_8_;
          auVar66._8_4_ = local_598._0_4_;
          auVar66._12_4_ = local_598._4_4_;
          dVar6 = pSVar12[LVar49].super_Matrix6x6.m_data[1];
          pdVar54 = pSVar12[LVar49].super_Matrix6x6.m_data + 2;
          dVar7 = *pdVar54;
          dVar8 = pdVar54[1];
          pdVar54 = pSVar12[LVar49].super_Matrix6x6.m_data + 4;
          dVar9 = *pdVar54;
          dVar10 = pdVar54[1];
          pdVar54 = pSVar12[LVar49].super_Matrix6x6.m_data + 6;
          dVar11 = pdVar54[1];
          dVar72 = auVar66._8_8_;
          auVar73._0_8_ = local_598._16_8_;
          auVar73._8_4_ = local_598._16_4_;
          auVar73._12_4_ = local_598._20_4_;
          pdVar63 = pSVar12[LVar49].super_Matrix6x6.m_data + 0xc;
          dVar17 = pdVar63[1];
          dVar74 = auVar73._8_8_;
          pdVar3 = pSVar12[LVar49].super_Matrix6x6.m_data + 0x12;
          dVar18 = pdVar3[1];
          auVar75._0_8_ = local_578._0_8_;
          auVar75._8_4_ = local_578._0_4_;
          auVar75._12_4_ = local_578._4_4_;
          pdVar4 = pSVar12[LVar49].super_Matrix6x6.m_data + 0x18;
          dVar19 = pdVar4[1];
          dVar76 = auVar75._8_8_;
          pdVar5 = pSVar12[LVar49].super_Matrix6x6.m_data + 0x1e;
          dVar20 = pdVar5[1];
          pdVar1 = pSVar12[LVar49].super_Matrix6x6.m_data + 8;
          dVar21 = *pdVar1;
          dVar22 = pdVar1[1];
          pdVar1 = pSVar12[LVar49].super_Matrix6x6.m_data + 0xe;
          dVar23 = *pdVar1;
          dVar24 = pdVar1[1];
          pdVar1 = pSVar12[LVar49].super_Matrix6x6.m_data + 0x14;
          dVar25 = *pdVar1;
          dVar26 = pdVar1[1];
          pdVar1 = pSVar12[LVar49].super_Matrix6x6.m_data + 0x1a;
          dVar27 = *pdVar1;
          dVar28 = pdVar1[1];
          pdVar1 = pSVar12[LVar49].super_Matrix6x6.m_data + 0x20;
          dVar29 = *pdVar1;
          dVar30 = pdVar1[1];
          pdVar1 = pSVar12[LVar49].super_Matrix6x6.m_data + 10;
          dVar31 = *pdVar1;
          dVar32 = pdVar1[1];
          pdVar1 = pSVar12[LVar49].super_Matrix6x6.m_data + 0x10;
          dVar33 = *pdVar1;
          dVar34 = pdVar1[1];
          pdVar1 = pSVar12[LVar49].super_Matrix6x6.m_data + 0x16;
          dVar35 = *pdVar1;
          dVar36 = pdVar1[1];
          pdVar1 = pSVar12[LVar49].super_Matrix6x6.m_data + 0x1c;
          dVar37 = *pdVar1;
          dVar38 = pdVar1[1];
          pdVar1 = pSVar12[LVar49].super_Matrix6x6.m_data + 0x22;
          dVar39 = *pdVar1;
          dVar40 = pdVar1[1];
          pMVar13[(long)dof].m_data[0] =
               *pdVar5 * (double)local_578._8_8_ +
               *pdVar4 * auVar75._0_8_ +
               *pdVar3 * (double)ppp_Stack_580 +
               *pdVar63 * auVar73._0_8_ +
               *pdVar54 * (double)local_598._8_8_ +
               pSVar12[LVar49].super_Matrix6x6.m_data[0] * auVar66._0_8_;
          pMVar13[(long)dof].m_data[1] =
               dVar20 * (double)local_578._8_8_ +
               dVar19 * dVar76 +
               dVar18 * (double)ppp_Stack_580 +
               dVar17 * dVar74 + dVar11 * (double)local_598._8_8_ + dVar6 * dVar72;
          pMVar13[(long)dof].m_data[2] =
               dVar29 * (double)local_578._8_8_ +
               dVar27 * auVar75._0_8_ +
               dVar25 * (double)ppp_Stack_580 +
               dVar23 * auVar73._0_8_ + dVar21 * (double)local_598._8_8_ + dVar7 * auVar66._0_8_;
          (pMVar13[(long)dof].m_data + 2)[1] =
               dVar30 * (double)local_578._8_8_ +
               dVar28 * dVar76 +
               dVar26 * (double)ppp_Stack_580 +
               dVar24 * dVar74 + dVar22 * (double)local_598._8_8_ + dVar8 * dVar72;
          pMVar13[(long)dof].m_data[4] =
               dVar39 * (double)local_578._8_8_ +
               dVar37 * auVar75._0_8_ +
               dVar35 * (double)ppp_Stack_580 +
               dVar33 * auVar73._0_8_ + dVar31 * (double)local_598._8_8_ + dVar9 * auVar66._0_8_;
          (pMVar13[(long)dof].m_data + 4)[1] =
               dVar40 * (double)local_578._8_8_ +
               dVar38 * dVar76 +
               dVar36 * (double)ppp_Stack_580 +
               dVar34 * dVar74 + dVar32 * (double)local_598._8_8_ + dVar10 * dVar72;
          pSVar12 = (bufs->dVb_linkBiasWrench).
                    super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_558 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                       *)local_598;
          pSStack_550 = local_568;
          iDynTree::ArticulatedBodyInertia::asMatrix();
          dVar6 = local_5c8;
          pSVar14 = (bufs->dVb_linkBiasAcceleration).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar56 = DOFSpatialForceArray::operator()(local_5d8,(size_t)local_5c8);
          local_3c8._0_8_ = *(undefined8 *)(pSVar56 + 8);
          local_3c8._8_8_ = *(undefined8 *)(pSVar56 + 0x10);
          local_3c8._16_8_ = *(undefined8 *)(pSVar56 + 0x18);
          local_3c8._24_8_ = *(undefined8 *)(pSVar56 + 0x20);
          local_3c8._32_8_ = *(undefined8 *)(pSVar56 + 0x28);
          local_3c8._40_8_ = *(undefined8 *)(pSVar56 + 0x30);
          pMVar13 = (bufs->dVb_u).
                    super__Vector_base<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar54 = (double *)
                    iDynTree::VectorDynSize::operator()((VectorDynSize *)local_5e8,(ulong)dVar6);
          local_1c8.m_other = *pdVar54;
          pdStack_210 = (PointerType)local_598;
          local_1e8 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                       *)local_3c8;
          local_5a8._0_8_ = local_388;
          local_228._8_8_ = pSVar12 + LVar49;
          pSStack_200 = pSVar14 + LVar49;
          pSStack_1e0 = (pointer)(pMVar13 + (long)dof);
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,0,6,6>const>const>const>,Eigen::internal::assign_op<double,double>>
                    (&local_5a8,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>_>
                      *)local_228,&local_5e9);
        }
        iVar47 = (*pIVar50->_vptr_IJoint[4])(pIVar50);
        if (iVar47 == 0) {
          __src = LinkArticulatedBodyInertias::operator()(local_5b8,LVar49);
          memcpy(local_108,__src,0xd8);
          pSVar12 = (bufs->dVb_linkBiasWrench).
                    super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iDynTree::ArticulatedBodyInertia::asMatrix();
          local_3c8._32_8_ =
               (bufs->dVb_linkBiasAcceleration).
               super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
               ._M_impl.super__Vector_impl_data._M_start + LVar49;
          local_3c8._16_8_ = local_228;
          local_3c8._0_8_ = (pointer)(pSVar12 + LVar49);
          Eigen::internal::
          assignment_from_xpr_op_product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,_6,_6,_1,_6,_6> *)local_598,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                      *)local_3c8,(assign_op<double,_double> *)&local_5a8);
          local_388 = (undefined1  [8])local_598._0_8_;
          dStack_380 = (double)local_598._8_8_;
          pTStack_378 = (Transform *)local_598._16_8_;
          dStack_370 = (double)ppp_Stack_580;
          adStack_368[0] = (double)local_578._0_8_;
          adStack_368[1] = (double)local_578._8_8_;
          local_358 = local_568;
          dStack_350 = dStack_560;
          local_348 = local_558;
          pSStack_340 = pSStack_550;
          local_338 = local_548[0];
          dStack_330 = local_548[1];
          local_328 = (double)local_538._0_8_;
          dStack_320 = (double)local_538._8_8_;
          local_318 = local_528;
          dStack_310 = dStack_520;
          local_308 = local_518[0];
          dStack_300 = local_518[1];
          local_2f8 = local_518[2];
          dStack_2f0 = local_518[3];
          local_2e8 = local_4f8;
          dStack_2e0 = dStack_4f0;
          local_2d8 = local_4e8[0];
          dStack_2d0 = local_4e8[1];
          local_2b8 = local_4c8;
          dStack_2b0 = dStack_4c0;
          local_2a8 = local_4b8[0];
          dStack_2a0 = local_4b8[1];
          local_298 = local_4b8[2];
          dStack_290 = local_4b8[3];
          local_288 = local_498;
          dStack_280 = dStack_490;
          local_278 = local_488[0];
          dStack_270 = local_488[1];
        }
        LVar51 = Link::getIndex(pLVar48);
        pJVar52 = FreeFloatingPos::jointPos(local_5e0);
        (*pIVar50->_vptr_IJoint[10])(pIVar50,pJVar52,LVar51,LVar49);
        iDynTree::Transform::asAdjointTransformWrench();
        local_218 = local_388;
        local_3c8._0_8_ =
             (bufs->dVb_linkBiasWrench).
             super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
             ._M_impl.super__Vector_impl_data._M_start + LVar51;
        local_228._0_8_ = (pointer)local_598;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>,Eigen::internal::add_assign_op<double,double>>
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_3c8,
                   (Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
                    *)local_228,(add_assign_op<double,_double> *)&local_5a8,(type)0x0);
      }
      bVar16 = 0 < (long)uVar64;
      uVar64 = uVar64 - 1;
    } while (bVar16);
  }
  uVar46 = Traversal::getNrOfVisitedLinks(traversal);
  if (uVar46 != 0) {
    local_3e0 = &(bufs->aba).U;
    local_3e8 = &(bufs->aba).D.super_VectorDynSize;
    local_3f0 = &(bufs->aba).linkABIs;
    uVar64 = 0;
    do {
      pLVar48 = Traversal::getLink(traversal,uVar64);
      LVar49 = Link::getIndex(pLVar48);
      pLVar48 = Traversal::getParentLink(traversal,uVar64);
      pIVar50 = Traversal::getParentJoint(traversal,uVar64);
      if (pLVar48 == (Link *)0x0) {
        LinkArticulatedBodyInertias::operator()(local_3f0,LVar49);
        iDynTree::ArticulatedBodyInertia::asMatrix();
        local_418 = 0;
        local_598._8_8_ = local_228._8_8_;
        local_598._0_8_ = local_228._0_8_;
        ppp_Stack_580 = (_func_int ***)pdStack_210;
        local_598._16_8_ = local_218;
        local_578._8_8_ = pSStack_200;
        local_578._0_8_ = local_208;
        local_568 = local_1f8;
        dStack_560 = dStack_1f0;
        local_558 = local_1e8;
        pSStack_550 = pSStack_1e0;
        local_548[0] = local_1d8;
        local_548[1] = dStack_1d0;
        local_538._8_8_ = uStack_1c0;
        local_538._0_8_ = local_1c8.m_other;
        local_528 = local_1b8;
        dStack_520 = dStack_1b0;
        local_518[0] = local_1a8;
        local_518[1] = dStack_1a0;
        local_518[2] = local_198;
        local_518[3] = dStack_190;
        local_4f8 = local_188;
        dStack_4f0 = dStack_180;
        local_4e8[0] = local_178;
        local_4e8[1] = dStack_170;
        local_4e8[2] = local_168;
        local_4e8[3] = dStack_160;
        local_4c8 = local_158;
        dStack_4c0 = dStack_150;
        local_4b8[0] = local_148;
        local_4b8[1] = dStack_140;
        local_4b8[2] = local_138;
        local_4b8[3] = dStack_130;
        local_498 = local_128;
        dStack_490 = dStack_120;
        local_488[0] = local_118;
        local_488[1] = dStack_110;
        Eigen::internal::
        householder_qr_inplace_blocked<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_double,_true>
        ::run((Matrix<double,_6,_6,_1,_6,_6> *)local_598,&local_478,0x30,local_448);
        local_418 = 1;
        local_108[0].m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = (PointerType)
                  ((bufs->dVb_linkBiasWrench).
                   super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                   ._M_impl.super__Vector_impl_data._M_start + LVar49);
        pSVar14 = (bufs->dVb_linksAccelerations).
                  super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTStack_378 = (Transform *)adStack_368;
        Eigen::HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>>::
        _solve_impl<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,6,6,1,6,6>>
                  ((HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>> *)local_598,
                   (Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_108,
                   (Matrix<double,_6,_6,_1,_6,_6> *)pTStack_378);
        dVar6 = *(double *)(pTStack_378 + 8);
        pSVar14[LVar49].super_Matrix6x6.m_data[0] = -*(double *)pTStack_378;
        pSVar14[LVar49].super_Matrix6x6.m_data[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x18);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 2;
        *pdVar54 = -*(double *)(pTStack_378 + 0x10);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x28);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 4;
        *pdVar54 = -*(double *)(pTStack_378 + 0x20);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x38);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 6;
        *pdVar54 = -*(double *)(pTStack_378 + 0x30);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x48);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 8;
        *pdVar54 = -*(double *)(pTStack_378 + 0x40);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x58);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 10;
        *pdVar54 = -*(double *)(pTStack_378 + 0x50);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x68);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0xc;
        *pdVar54 = -*(double *)(pTStack_378 + 0x60);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x78);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0xe;
        *pdVar54 = -*(double *)(pTStack_378 + 0x70);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x88);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x10;
        *pdVar54 = -*(double *)(pTStack_378 + 0x80);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x98);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x12;
        *pdVar54 = -*(double *)(pTStack_378 + 0x90);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0xa8);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x14;
        *pdVar54 = -*(double *)(pTStack_378 + 0xa0);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0xb8);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x16;
        *pdVar54 = -*(double *)(pTStack_378 + 0xb0);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 200);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x18;
        *pdVar54 = -*(double *)(pTStack_378 + 0xc0);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0xd8);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x1a;
        *pdVar54 = -*(double *)(pTStack_378 + 0xd0);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0xe8);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x1c;
        *pdVar54 = -*(double *)(pTStack_378 + 0xe0);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0xf8);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x1e;
        *pdVar54 = -*(double *)(pTStack_378 + 0xf0);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x108);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x20;
        *pdVar54 = -*(double *)(pTStack_378 + 0x100);
        pdVar54[1] = -dVar6;
        dVar6 = *(double *)(pTStack_378 + 0x118);
        pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x22;
        *pdVar54 = -*(double *)(pTStack_378 + 0x110);
        pdVar54[1] = -dVar6;
        pSVar14 = (bufs->dVb_linksAccelerations).
                  super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar61 = iDynTree::MatrixDynSize::data();
        iDynTree::MatrixDynSize::rows();
        lVar62 = iDynTree::MatrixDynSize::cols();
        pMVar45 = local_5c0;
        sVar59 = Model::getNrOfDOFs(local_5c0);
        sVar57 = Model::getNrOfDOFs(pMVar45);
        puVar60 = (undefined8 *)(lVar61 + sVar57 * 8 + (sVar59 + 6) * lVar62 * 8 + 0x50);
        lVar61 = 0x20;
        do {
          puVar2 = (undefined8 *)((long)pSVar14[LVar49].super_Matrix6x6.m_data + lVar61 + -0x20);
          uVar44 = puVar2[1];
          puVar60[-4] = *puVar2;
          puVar60[-3] = uVar44;
          puVar2 = (undefined8 *)((long)pSVar14[LVar49].super_Matrix6x6.m_data + lVar61 + -0x10);
          uVar44 = puVar2[1];
          puVar60[-2] = *puVar2;
          puVar60[-1] = uVar44;
          puVar2 = (undefined8 *)((long)pSVar14[LVar49].super_Matrix6x6.m_data + lVar61);
          uVar44 = puVar2[1];
          *puVar60 = *puVar2;
          puVar60[1] = uVar44;
          lVar61 = lVar61 + 0x30;
          puVar60 = puVar60 + lVar62;
        } while (lVar61 != 0x140);
      }
      else {
        LVar51 = Link::getIndex(pLVar48);
        iVar47 = (*pIVar50->_vptr_IJoint[4])(pIVar50);
        if (iVar47 == 0) {
          pJVar52 = FreeFloatingPos::jointPos(local_5e0);
          (*pIVar50->_vptr_IJoint[10])(pIVar50,pJVar52,LVar49,LVar51);
          iDynTree::Transform::asAdjointTransform();
          pSVar14 = (bufs->dVb_linksAccelerations).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar15 = (bufs->dVb_linkBiasAcceleration).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar54 = (double *)local_578;
          lVar61 = 0;
          do {
            dVar6 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61];
            dVar7 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61 + 6];
            dVar8 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61 + 0xc];
            dVar9 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61 + 0x12];
            dVar10 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61 + 0x18];
            dVar11 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61 + 0x1e];
            lVar62 = 0;
            pdVar63 = pdVar54;
            do {
              pSVar12 = (&pSStack_340)[lVar62 + 1];
              pSVar41 = (&pSStack_340)[lVar62 + 2];
              pCVar42 = (&local_348)[lVar62];
              pSVar43 = (&pSStack_340)[lVar62];
              dVar17 = adStack_368[lVar62 + 2];
              dVar18 = adStack_368[lVar62 + 3];
              *pdVar63 = adStack_368[lVar62 + 1] * dVar11 + adStack_368[lVar62] * dVar10 +
                         (&dStack_370)[lVar62] * dVar9 +
                         (double)(&pTStack_378)[lVar62] * dVar8 + (&dStack_380)[lVar62] * dVar7 +
                         *(double *)(local_388 + lVar62 * 8) * dVar6;
              pdVar63[1] = (double)pSVar41 * dVar11 + (double)pSVar12 * dVar10 +
                           (double)pSVar43 * dVar9 +
                           (double)pCVar42 * dVar8 + dVar18 * dVar7 + dVar17 * dVar6;
              pdVar63 = pdVar63 + 2;
              lVar62 = lVar62 + 0xc;
            } while (lVar62 != 0x24);
            lVar61 = lVar61 + 1;
            pdVar54 = pdVar54 + 6;
          } while (lVar61 != 6);
          lVar61 = 5;
          pdVar54 = (double *)local_578;
          do {
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61 + -5] =
                 *pdVar54 + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61 + -5];
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61 + -4] =
                 pdVar54[6] + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61 + -4];
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61 + -3] =
                 pdVar54[0xc] + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61 + -3];
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61 + -2] =
                 pdVar54[0x12] + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61 + -2];
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61 + -1] =
                 pdVar54[0x18] + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61 + -1];
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61] =
                 pdVar54[0x1e] + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61];
            lVar61 = lVar61 + 6;
            pdVar54 = pdVar54 + 1;
          } while (lVar61 != 0x29);
        }
        else {
          iVar47 = (*pIVar50->_vptr_IJoint[0x18])(pIVar50);
          sVar59 = CONCAT44(extraout_var_02,iVar47);
          pJVar52 = FreeFloatingPos::jointPos(local_5e0);
          (*pIVar50->_vptr_IJoint[10])(pIVar50,pJVar52,LVar49,LVar51);
          iDynTree::Transform::asAdjointTransform();
          pSVar14 = (bufs->dVb_linksAccelerations).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar15 = (bufs->dVb_linkBiasAcceleration).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar54 = (double *)local_578;
          lVar61 = 0;
          do {
            dVar6 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61];
            dVar7 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61 + 6];
            dVar8 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61 + 0xc];
            dVar9 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61 + 0x12];
            dVar10 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61 + 0x18];
            dVar11 = pSVar14[LVar51].super_Matrix6x6.m_data[lVar61 + 0x1e];
            lVar62 = 0;
            pdVar63 = pdVar54;
            do {
              pSVar12 = (&pSStack_340)[lVar62 + 1];
              pSVar41 = (&pSStack_340)[lVar62 + 2];
              pCVar42 = (&local_348)[lVar62];
              pSVar43 = (&pSStack_340)[lVar62];
              dVar17 = adStack_368[lVar62 + 2];
              dVar18 = adStack_368[lVar62 + 3];
              *pdVar63 = adStack_368[lVar62 + 1] * dVar11 + adStack_368[lVar62] * dVar10 +
                         (&dStack_370)[lVar62] * dVar9 +
                         (double)(&pTStack_378)[lVar62] * dVar8 + (&dStack_380)[lVar62] * dVar7 +
                         *(double *)(local_388 + lVar62 * 8) * dVar6;
              pdVar63[1] = (double)pSVar41 * dVar11 + (double)pSVar12 * dVar10 +
                           (double)pSVar43 * dVar9 +
                           (double)pCVar42 * dVar8 + dVar18 * dVar7 + dVar17 * dVar6;
              pdVar63 = pdVar63 + 2;
              lVar62 = lVar62 + 0xc;
            } while (lVar62 != 0x24);
            lVar61 = lVar61 + 1;
            pdVar54 = pdVar54 + 6;
          } while (lVar61 != 6);
          lVar61 = 5;
          pdVar54 = (double *)local_578;
          do {
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61 + -5] =
                 *pdVar54 + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61 + -5];
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61 + -4] =
                 pdVar54[6] + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61 + -4];
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61 + -3] =
                 pdVar54[0xc] + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61 + -3];
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61 + -2] =
                 pdVar54[0x12] + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61 + -2];
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61 + -1] =
                 pdVar54[0x18] + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61 + -1];
            pSVar14[LVar49].super_Matrix6x6.m_data[lVar61] =
                 pdVar54[0x1e] + pSVar15[LVar49].super_Matrix6x6.m_data[lVar61];
            lVar61 = lVar61 + 6;
            pdVar54 = pdVar54 + 1;
          } while (lVar61 != 0x29);
          local_5e8 = (FreeFloatingVel *)
                      (bufs->dVb_u).
                      super__Vector_base<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_5d8 = (DOFSpatialForceArray *)(sVar59 * 0x30);
          local_3d0 = &local_5e8->_vptr_FreeFloatingVel + sVar59 * 6;
          pSVar56 = DOFSpatialForceArray::operator()(local_3e0,sVar59);
          local_248 = *(double *)(pSVar56 + 8);
          dStack_240 = *(double *)(pSVar56 + 0x10);
          local_238 = *(double *)(pSVar56 + 0x18);
          uStack_230 = *(undefined8 *)(pSVar56 + 0x20);
          local_5b8 = *(LinkArticulatedBodyInertias **)(pSVar56 + 0x20);
          dStack_5b0 = *(double *)(pSVar56 + 0x28);
          pSVar14 = (bufs->dVb_linksAccelerations).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_408 = *(ArticulatedBodyInertia **)(pSVar56 + 0x30);
          uStack_400 = 0;
          pdVar54 = (double *)iDynTree::VectorDynSize::operator()(local_3e8,sVar59);
          local_5c8 = *pdVar54;
          local_3d8 = iDynTree::MatrixDynSize::data();
          iDynTree::MatrixDynSize::rows();
          lVar62 = iDynTree::MatrixDynSize::cols();
          pMVar45 = local_5c0;
          sVar57 = Model::getNrOfDOFs(local_5c0);
          sVar58 = Model::getNrOfDOFs(pMVar45);
          lVar61 = local_3d8 + sVar58 * 8;
          lVar62 = (sVar57 + sVar59 + 0xc) * lVar62;
          ppp_Stack_580 = local_3d0;
          local_568 = (pointer)&local_558;
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 6;
          pdVar63 = pSVar14[LVar49].super_Matrix6x6.m_data + 0xc;
          pdVar1 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x12;
          pdVar3 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x18;
          pdVar4 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x1e;
          local_558 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                       *)(*pdVar4 * (double)local_408 +
                         *pdVar3 * dStack_5b0 +
                         *pdVar1 * (double)local_5b8 +
                         *pdVar63 * local_238 +
                         *pdVar54 * dStack_240 +
                         pSVar14[LVar49].super_Matrix6x6.m_data[0] * local_248);
          pSStack_550 = (pointer)(pdVar4[1] * (double)local_408 +
                                 pdVar3[1] * dStack_5b0 +
                                 pdVar1[1] * (double)local_5b8 +
                                 pdVar63[1] * local_238 +
                                 pdVar54[1] * dStack_240 +
                                 pSVar14[LVar49].super_Matrix6x6.m_data[1] * local_248);
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 2;
          pdVar63 = pSVar14[LVar49].super_Matrix6x6.m_data + 8;
          pdVar1 = pSVar14[LVar49].super_Matrix6x6.m_data + 0xe;
          pdVar3 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x14;
          pdVar4 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x1a;
          pdVar5 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x20;
          local_548[0] = *pdVar5 * (double)local_408 +
                         *pdVar4 * dStack_5b0 +
                         *pdVar3 * (double)local_5b8 +
                         *pdVar1 * local_238 + *pdVar63 * dStack_240 + *pdVar54 * local_248;
          local_548[1] = pdVar5[1] * (double)local_408 +
                         pdVar4[1] * dStack_5b0 +
                         pdVar3[1] * (double)local_5b8 +
                         pdVar1[1] * local_238 + pdVar63[1] * dStack_240 + pdVar54[1] * local_248;
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 4;
          pdVar63 = pSVar14[LVar49].super_Matrix6x6.m_data + 10;
          pdVar1 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x10;
          pdVar3 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x16;
          pdVar4 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x1c;
          pdVar5 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x22;
          dVar6 = *pdVar5 * (double)local_408 +
                  *pdVar4 * dStack_5b0 +
                  *pdVar3 * (double)local_5b8 +
                  *pdVar1 * local_238 + *pdVar63 * dStack_240 + *pdVar54 * local_248;
          dVar7 = pdVar5[1] * (double)local_408 +
                  pdVar4[1] * dStack_5b0 +
                  pdVar3[1] * (double)local_5b8 +
                  pdVar1[1] * local_238 + pdVar63[1] * dStack_240 + pdVar54[1] * local_248;
          local_538._8_4_ = SUB84(dVar7,0);
          local_538._0_8_ = dVar6;
          local_538._12_4_ = (int)((ulong)dVar7 >> 0x20);
          local_528 = local_5c8;
          pdVar54 = (double *)((long)&local_5e8->_vptr_FreeFloatingVel + (long)local_5d8);
          auVar65._0_8_ = *pdVar54 - (double)local_558;
          auVar65._8_8_ = pdVar54[1] - (double)pSStack_550;
          auVar69._8_8_ = local_5c8;
          auVar69._0_8_ = local_5c8;
          auVar66 = divpd(auVar65,auVar69);
          *(undefined1 (*) [16])(lVar61 + 0x30 + lVar62 * 8) = auVar66;
          auVar67._0_8_ = (double)local_3d0[2] - local_548[0];
          auVar67._8_8_ = (double)local_3d0[3] - local_548[1];
          auVar70._8_8_ = local_5c8;
          auVar70._0_8_ = local_5c8;
          auVar66 = divpd(auVar67,auVar70);
          *(undefined1 (*) [16])(lVar61 + 0x40 + lVar62 * 8) = auVar66;
          auVar68._0_8_ = (double)local_3d0[4] - dVar6;
          auVar68._8_8_ = (double)local_3d0[5] - (double)local_538._8_8_;
          auVar71._8_8_ = local_5c8;
          auVar71._0_8_ = local_5c8;
          auVar66 = divpd(auVar68,auVar71);
          *(undefined1 (*) [16])(lVar61 + 0x50 + lVar62 * 8) = auVar66;
          pSVar14 = (bufs->dVb_linksAccelerations).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar55 = DOFSpatialMotionArray::operator()((DOFSpatialMotionArray *)bufs,sVar59);
          local_388 = (undefined1  [8])
                      (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                      super_Vector3.m_data[0];
          dStack_380 = (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                       super_Vector3.m_data[1];
          pTStack_378 = (Transform *)
                        (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                        super_Vector3.m_data[2];
          dStack_370 = (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                       super_Vector3.m_data[0];
          adStack_368[0] =
               (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
               super_Vector3.m_data[1];
          adStack_368[1] =
               (pSVar55->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
               super_Vector3.m_data[2];
          local_5d8 = (DOFSpatialForceArray *)iDynTree::MatrixDynSize::data();
          iDynTree::MatrixDynSize::rows();
          lVar61 = iDynTree::MatrixDynSize::cols();
          pMVar45 = local_5c0;
          sVar57 = Model::getNrOfDOFs(local_5c0);
          sVar58 = Model::getNrOfDOFs(pMVar45);
          pSVar15 = (bufs->dVb_linksAccelerations).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_598._0_16_ = *(undefined1 (*) [16])pSVar14[LVar49].super_Matrix6x6.m_data;
          stack0xfffffffffffffa78 =
               *(undefined1 (*) [16])(pSVar14[LVar49].super_Matrix6x6.m_data + 2);
          local_578 = *(undefined1 (*) [16])(pSVar14[LVar49].super_Matrix6x6.m_data + 4);
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 6;
          local_568 = (pointer)*pdVar54;
          dStack_560 = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 8;
          local_558 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                       *)*pdVar54;
          pSStack_550 = (pointer)pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 10;
          local_548[0] = *pdVar54;
          local_548[1] = pdVar54[1];
          local_538 = *(undefined1 (*) [16])(pSVar14[LVar49].super_Matrix6x6.m_data + 0xc);
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0xe;
          local_528 = *pdVar54;
          dStack_520 = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x10;
          local_518[0] = *pdVar54;
          local_518[1] = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x12;
          local_518[2] = *pdVar54;
          local_518[3] = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x14;
          local_4f8 = *pdVar54;
          dStack_4f0 = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x16;
          local_4e8[0] = *pdVar54;
          local_4e8[1] = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x18;
          local_4e8[2] = *pdVar54;
          local_4e8[3] = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x1a;
          local_4c8 = *pdVar54;
          dStack_4c0 = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x1c;
          local_4b8[0] = *pdVar54;
          local_4b8[1] = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x1e;
          local_4b8[2] = *pdVar54;
          local_4b8[3] = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x20;
          local_498 = *pdVar54;
          dStack_490 = pdVar54[1];
          pdVar54 = pSVar14[LVar49].super_Matrix6x6.m_data + 0x22;
          local_488[0] = *pdVar54;
          local_488[1] = pdVar54[1];
          lVar61 = (sVar57 + sVar59 + 0xc) * lVar61;
          dVar6 = *(double *)((long)(local_5d8 + 2) + lVar61 * 8 + sVar58 * 8);
          dVar7 = *(double *)((long)(local_5d8 + 2) + lVar61 * 8 + sVar58 * 8 + 8);
          dVar8 = *(double *)((long)(local_5d8 + 2) + lVar61 * 8 + sVar58 * 8 + 0x10);
          dVar9 = *(double *)((long)(local_5d8 + 3) + lVar61 * 8 + sVar58 * 8);
          dVar10 = *(double *)((long)(local_5d8 + 3) + lVar61 * 8 + sVar58 * 8 + 8);
          dVar11 = *(double *)((long)(local_5d8 + 3) + lVar61 * 8 + sVar58 * 8 + 0x10);
          pdVar54 = (double *)local_598;
          lVar61 = 0;
          do {
            dVar17 = *(double *)(local_388 + lVar61 * 8);
            dVar18 = (&dStack_380)[lVar61];
            *pdVar54 = *pdVar54 + dVar6 * dVar17;
            pdVar54[1] = dVar7 * dVar17 + pdVar54[1];
            pdVar54[2] = dVar8 * dVar17 + pdVar54[2];
            pdVar54[3] = dVar9 * dVar17 + pdVar54[3];
            pdVar54[4] = dVar10 * dVar17 + pdVar54[4];
            pdVar54[5] = dVar17 * dVar11 + pdVar54[5];
            pdVar54[6] = pdVar54[6] + dVar6 * dVar18;
            pdVar54[7] = dVar7 * dVar18 + pdVar54[7];
            pdVar54[8] = dVar8 * dVar18 + pdVar54[8];
            pdVar54[9] = dVar9 * dVar18 + pdVar54[9];
            pdVar54[10] = dVar10 * dVar18 + pdVar54[10];
            pdVar54[0xb] = dVar18 * dVar11 + pdVar54[0xb];
            lVar61 = lVar61 + 2;
            pdVar54 = pdVar54 + 0xc;
          } while (lVar61 != 6);
          pSVar15[LVar49].super_Matrix6x6.m_data[0] = (double)local_598._0_8_;
          pSVar15[LVar49].super_Matrix6x6.m_data[1] = (double)local_598._8_8_;
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 2;
          *pdVar54 = (double)local_598._16_8_;
          pdVar54[1] = (double)ppp_Stack_580;
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 4;
          *pdVar54 = (double)local_578._0_8_;
          pdVar54[1] = (double)local_578._8_8_;
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 6;
          *pdVar54 = (double)local_568;
          pdVar54[1] = dStack_560;
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 8;
          *pdVar54 = (double)local_558;
          pdVar54[1] = (double)pSStack_550;
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 10;
          *pdVar54 = local_548[0];
          pdVar54[1] = local_548[1];
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0xc;
          *pdVar54 = (double)local_538._0_8_;
          pdVar54[1] = (double)local_538._8_8_;
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0xe;
          *pdVar54 = local_528;
          pdVar54[1] = dStack_520;
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0x10;
          *pdVar54 = local_518[0];
          pdVar54[1] = local_518[1];
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0x12;
          *pdVar54 = local_518[2];
          pdVar54[1] = local_518[3];
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0x14;
          *pdVar54 = local_4f8;
          pdVar54[1] = dStack_4f0;
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0x16;
          *pdVar54 = local_4e8[0];
          pdVar54[1] = local_4e8[1];
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0x18;
          *pdVar54 = local_4e8[2];
          pdVar54[1] = local_4e8[3];
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0x1a;
          *pdVar54 = local_4c8;
          pdVar54[1] = dStack_4c0;
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0x1c;
          *pdVar54 = local_4b8[0];
          pdVar54[1] = local_4b8[1];
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0x1e;
          *pdVar54 = local_4b8[2];
          pdVar54[1] = local_4b8[3];
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0x20;
          *pdVar54 = local_498;
          pdVar54[1] = dStack_490;
          pdVar54 = pSVar15[LVar49].super_Matrix6x6.m_data + 0x22;
          *pdVar54 = local_488[0];
          pdVar54[1] = local_488[1];
        }
      }
      uVar64 = uVar64 + 1;
      uVar46 = Traversal::getNrOfVisitedLinks(traversal);
    } while (uVar64 < uVar46);
  }
  return;
}

Assistant:

void ForwardDynamicsLinearizationWrtBaseTwist(const Model& model,
                                              const Traversal& traversal,
                                              const FreeFloatingPos& robotPos,
                                              const FreeFloatingVel& robotVel,
                                              const LinkNetExternalWrenches& linkExtWrenches,
                                              const JointDOFsDoubleArray& jointTorques,
                                              ForwardDynamicsLinearizationInternalBuffers & bufs,
                                              FreeFloatingAcc& robotAcc,
                                              FreeFloatingStateLinearization& A)
{
    //std::cout << "ForwardDynamicsLinearizationWrtBaseTwist A : " << A.toString() << std::endl;
    /**
     * Forward pass: compute the derivatives of  link velocities and of link bias accelerations
     * with respect to the base twist.
     * In particur, the derivative of the linkVelocity[l] with respect to the base velocity
     * is just the \f$ ~^b X_l \f$ transform, so we just compute that transform for the derivative
     * of link velocity with respect to base velocity.
     * We don't such a strong structure for the derivative with respect to the link bias acceleration,
     * so store it as a 6x6 matrix.
     */
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        // Propagate the derivatives of velocities and bias accelerations

        // If the visitedLink is the base one, initialize the derivative of the link velocity
        // with respect to the base velocity to identiy
        if( parentLink == 0 )
        {
            bufs.linkPos(visitedLinkIndex) = iDynTree::Transform::Identity();
            bufs.dVb_linkBiasAcceleration[visitedLinkIndex].zero();
        }
        else
        {
            LinkIndex    parentLinkIndex = parentLink->getIndex();
            bufs.linkPos(visitedLinkIndex) =
                    toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLink->getIndex())*bufs.linkPos(parentLinkIndex);

            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                bufs.dVb_linkBiasAcceleration[visitedLinkIndex].zero();
            }
            else
            {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               double dql      = robotVel.jointVel()(dofIndex);
               iDynTree::SpatialMotionVector & S = bufs.aba.S(dofIndex);

               toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]) = toEigen((S*(-dql)).asCrossProductMatrix())*toEigen( bufs.linkPos(visitedLinkIndex).asAdjointTransform());
            }
        }

       //std::cout << " dVl_linkLocalBiasWrench : " << bufs.dVl_linkLocalBiasWrench[visitedLinkIndex].toString() << std::endl;
       toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]) = toEigen(bufs.dVl_linkLocalBiasWrench[visitedLinkIndex])*toEigen( bufs.linkPos(visitedLinkIndex).asAdjointTransform());


    }

    /*
     * Backward pass: recursivly compute
     * the derivative of articulated body bias wrench
     * with respect to the base velocity.
     *
     */
    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);


        if( parentLink )
        {
            // For now we support only 0 and 1 dof joints
            Matrix6x6 dVb_pa;
            ArticulatedBodyInertia Ia;

            // for 1 dof joints, the articulated inertia
            // need to be propagated to the parent considering
            // the joints
            if( toParentJoint->getNrOfDOFs() > 0 )
            {
                assert(toParentJoint->getNrOfDOFs()==1);
                size_t dofIndex = toParentJoint->getDOFsOffset();

                Ia = bufs.aba.linkABIs(visitedLinkIndex)
                    - ArticulatedBodyInertia::ABADyadHelper(bufs.aba.U(dofIndex),bufs.aba.D(dofIndex));

                toEigen(bufs.dVb_u[dofIndex]) = -toEigen(bufs.aba.S(dofIndex)).transpose()*toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]);
                toEigen(dVb_pa)  =  toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex])
                                     + toEigen(Ia.asMatrix())*toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex])
                                     + toEigen(bufs.aba.U(dofIndex))*toEigen(bufs.dVb_u[dofIndex])/bufs.aba.D(dofIndex);

            }

            // For fixed joints, we just need to propate
            // the articulated quantities without considering the
            // joint
            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                Ia = bufs.aba.linkABIs(visitedLinkIndex);
                toEigen(dVb_pa)   =  toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex])
                                     + toEigen(Ia.asMatrix())*toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
            }

            // Propagate
            LinkIndex parentLinkIndex = parentLink->getIndex();
            const Transform & parent_X_visited = toParentJoint->getTransform(robotPos.jointPos(),parentLinkIndex,visitedLinkIndex);
            toEigen(bufs.dVb_linkBiasWrench[parentLinkIndex]) += toEigen(parent_X_visited.asAdjointTransformWrench())*toEigen(dVb_pa);
        }
    }


    /**
     * Second forward pass: find robot accelerations
     *
     */
    // \todo TODO Handle gravity
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
       LinkConstPtr visitedLink = traversal.getLink(traversalEl);
       LinkIndex visitedLinkIndex = visitedLink->getIndex();
       LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
       IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

       if( parentLink == 0 )
       {
           // Preliminary step: find base acceleration
           //std::cout << "bufs.dVb_linkBiasWrench : "<<  bufs.dVb_linkBiasWrench[visitedLinkIndex].toString() << std::endl;
           toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) = -toEigen(bufs.aba.linkABIs(visitedLinkIndex).asMatrix()).householderQr().solve(toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]));
           // Start storing the result in the linearization matrix
           toEigen(A).block<6,6>(6+model.getNrOfDOFs(),6+model.getNrOfDOFs()) = toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]);
           /*
           std::cout << "Acceleration setted : " << std::endl;
           std::cout << toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) << std::endl;
           std::cout << "Resulting A " << std::endl;
           */
        }
       else
       {
           LinkIndex    parentLinkIndex = parentLink->getIndex();
           if( toParentJoint->getNrOfDOFs() > 0 )
           {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               assert(toParentJoint->getNrOfDOFs()==1);
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) =
                   toEigen(toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex).asAdjointTransform())*toEigen(bufs.dVb_linksAccelerations[parentLinkIndex])
                   + toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
               toEigen(A).block<1,6>(6+model.getNrOfDOFs()+6+dofIndex,6+model.getNrOfDOFs())  = (toEigen(bufs.dVb_u[dofIndex]) - toEigen(bufs.aba.U(dofIndex)).transpose()*toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]))/bufs.aba.D(dofIndex);
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) = toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) + toEigen(bufs.aba.S(dofIndex))*toEigen(A).block<1,6>(6+model.getNrOfDOFs()+6+dofIndex,6+model.getNrOfDOFs());
           }
           else
           {
               //for fixed joints we just propagate the acceleration
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) =
                   toEigen(toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex).asAdjointTransform())*toEigen(bufs.dVb_linksAccelerations[parentLinkIndex])
                   + toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
           }
       }
    }
}